

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveRowsTable(tst_GenericModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_reference pQVar4;
  QModelIndex local_17d0;
  QModelIndex local_17b8;
  undefined1 local_17a0 [8];
  value_type args_3;
  qsizetype local_1780;
  QSignalSpy *local_1778;
  QSignalSpy *spy_9;
  QSignalSpy **__end1_9;
  QSignalSpy **__begin1_9;
  QSignalSpy *(*__range1_9) [2];
  QVariant local_1750;
  QChar local_172e;
  QLatin1Char local_172b;
  QChar local_172a;
  QModelIndex local_1728;
  QModelIndex local_1710;
  QVariant local_16f8;
  QChar local_16d6;
  QLatin1Char local_16d3;
  QChar local_16d2;
  QModelIndex local_16d0;
  QModelIndex local_16b8;
  QVariant local_16a0;
  QChar local_167e;
  QLatin1Char local_167b;
  QChar local_167a;
  QModelIndex local_1678;
  QModelIndex local_1660;
  QVariant local_1648;
  QChar local_1626;
  QLatin1Char local_1623;
  QChar local_1622;
  QModelIndex local_1620;
  QModelIndex local_1608;
  QVariant local_15f0;
  QChar local_15ce;
  QLatin1Char local_15cb;
  QChar local_15ca;
  QModelIndex local_15c8;
  QModelIndex local_15b0;
  QVariant local_1598;
  QChar local_1576;
  QLatin1Char local_1573;
  QChar local_1572;
  QModelIndex local_1570;
  QModelIndex local_1558;
  QVariant local_1540;
  QChar local_151a;
  QModelIndex local_1518;
  QModelIndex local_1500;
  QVariant local_14e8;
  QModelIndex local_14c8;
  QModelIndex local_14b0;
  QVariant local_1498;
  QModelIndex local_1478;
  QModelIndex local_1460;
  QVariant local_1448;
  QModelIndex local_1428;
  QModelIndex local_1410;
  QVariant local_13f8;
  QModelIndex local_13d8;
  QModelIndex local_13c0;
  QVariant local_13a8;
  QModelIndex local_1388;
  QModelIndex local_1370;
  QVariant local_1358;
  QModelIndex local_1338;
  QModelIndex local_1320;
  QModelIndex local_1308;
  undefined1 local_12f0 [24];
  QPersistentModelIndex local_12d8 [8];
  QPersistentModelIndex oneIndex;
  QModelIndex local_12b8;
  undefined1 local_12a0 [8];
  value_type args_2;
  qsizetype local_1280;
  QSignalSpy *local_1278;
  QSignalSpy *spy_8;
  QSignalSpy **__end1_8;
  QSignalSpy **__begin1_8;
  QSignalSpy *(*__range1_8) [2];
  QVariant local_1250;
  QChar local_122e;
  QLatin1Char local_122b;
  QChar local_122a;
  QModelIndex local_1228;
  QModelIndex local_1210;
  QVariant local_11f8;
  QChar local_11d6;
  QLatin1Char local_11d3;
  QChar local_11d2;
  QModelIndex local_11d0;
  QModelIndex local_11b8;
  QVariant local_11a0;
  QChar local_117e;
  QLatin1Char local_117b;
  QChar local_117a;
  QModelIndex local_1178;
  QModelIndex local_1160;
  QVariant local_1148;
  QChar local_1126;
  QLatin1Char local_1123;
  QChar local_1122;
  QModelIndex local_1120;
  QModelIndex local_1108;
  QVariant local_10f0;
  QChar local_10ce;
  QLatin1Char local_10cb;
  QChar local_10ca;
  QModelIndex local_10c8;
  QModelIndex local_10b0;
  QVariant local_1098;
  QChar local_1076;
  QLatin1Char local_1073;
  QChar local_1072;
  QModelIndex local_1070;
  QModelIndex local_1058;
  QVariant local_1040;
  QChar local_101a;
  QModelIndex local_1018;
  QModelIndex local_1000;
  QVariant local_fe8;
  QModelIndex local_fc8;
  QModelIndex local_fb0;
  QVariant local_f98;
  QModelIndex local_f78;
  QModelIndex local_f60;
  QVariant local_f48;
  QModelIndex local_f28;
  QModelIndex local_f10;
  QVariant local_ef8;
  QModelIndex local_ed8;
  QModelIndex local_ec0;
  QVariant local_ea8;
  QModelIndex local_e88;
  QModelIndex local_e70;
  QVariant local_e58;
  QModelIndex local_e38;
  QModelIndex local_e20;
  QModelIndex local_e08;
  undefined1 local_df0 [24];
  QModelIndex local_dd8;
  QModelIndex local_dc0;
  undefined1 local_da8 [8];
  value_type args_1;
  qsizetype local_d88;
  QSignalSpy *local_d80;
  QSignalSpy *spy_7;
  QSignalSpy **__end1_7;
  QSignalSpy **__begin1_7;
  QSignalSpy *(*__range1_7) [2];
  QVariant local_d58;
  QChar local_d36;
  QLatin1Char local_d33;
  QChar local_d32;
  QModelIndex local_d30;
  QModelIndex local_d18;
  QVariant local_d00;
  QChar local_cde;
  QLatin1Char local_cdb;
  QChar local_cda;
  QModelIndex local_cd8;
  QModelIndex local_cc0;
  QVariant local_ca8;
  QChar local_c86;
  QLatin1Char local_c83;
  QChar local_c82;
  QModelIndex local_c80;
  QModelIndex local_c68;
  QVariant local_c50;
  QChar local_c2e;
  QLatin1Char local_c2b;
  QChar local_c2a;
  QModelIndex local_c28;
  QModelIndex local_c10;
  QVariant local_bf8;
  QChar local_bd6;
  QLatin1Char local_bd3;
  QChar local_bd2;
  QModelIndex local_bd0;
  QModelIndex local_bb8;
  QVariant local_ba0;
  QChar local_b7e;
  QLatin1Char local_b7b;
  QChar local_b7a;
  QModelIndex local_b78;
  QModelIndex local_b60;
  QVariant local_b48;
  QChar local_b22;
  QModelIndex local_b20;
  QModelIndex local_b08;
  QVariant local_af0;
  QModelIndex local_ad0;
  QModelIndex local_ab8;
  QVariant local_aa0;
  QModelIndex local_a80;
  QModelIndex local_a68;
  QVariant local_a50;
  QModelIndex local_a30;
  QModelIndex local_a18;
  QVariant local_a00;
  QModelIndex local_9e0;
  QModelIndex local_9c8;
  QVariant local_9b0;
  QModelIndex local_990;
  QModelIndex local_978;
  QVariant local_960;
  QModelIndex local_940;
  QModelIndex local_928;
  QModelIndex local_910;
  undefined1 local_8f8 [24];
  QModelIndex local_8e0;
  QModelIndex local_8c8;
  undefined1 local_8b0 [8];
  value_type args;
  qsizetype local_890;
  QSignalSpy *local_888;
  QSignalSpy *spy_6;
  QSignalSpy **__end1_6;
  QSignalSpy **__begin1_6;
  QSignalSpy *(*__range1_6) [2];
  QVariant local_860;
  QChar local_83e;
  QLatin1Char local_83b;
  QChar local_83a;
  QModelIndex local_838;
  QModelIndex local_820;
  QVariant local_808;
  QChar local_7e6;
  QLatin1Char local_7e3;
  QChar local_7e2;
  QModelIndex local_7e0;
  QModelIndex local_7c8;
  QVariant local_7b0;
  QChar local_78e;
  QLatin1Char local_78b;
  QChar local_78a;
  QModelIndex local_788;
  QModelIndex local_770;
  QVariant local_758;
  QChar local_736;
  QLatin1Char local_733;
  QChar local_732;
  QModelIndex local_730;
  QModelIndex local_718;
  QVariant local_700;
  QChar local_6de;
  QLatin1Char local_6db;
  QChar local_6da;
  QModelIndex local_6d8;
  QModelIndex local_6c0;
  QVariant local_6a8;
  QChar local_686;
  QLatin1Char local_683;
  QChar local_682;
  QModelIndex local_680;
  QModelIndex local_668;
  QVariant local_650;
  QChar local_62a;
  QModelIndex local_628;
  QModelIndex local_610;
  QVariant local_5f8;
  QModelIndex local_5d8;
  QModelIndex local_5c0;
  QVariant local_5a8;
  QModelIndex local_588;
  QModelIndex local_570;
  QVariant local_558;
  QModelIndex local_538;
  QModelIndex local_520;
  QVariant local_508;
  QModelIndex local_4e8;
  QModelIndex local_4d0;
  QVariant local_4b8;
  QModelIndex local_498;
  QModelIndex local_480;
  QVariant local_468;
  QModelIndex local_448;
  QModelIndex local_430;
  QModelIndex local_418;
  undefined1 local_400 [24];
  QPersistentModelIndex local_3e8 [8];
  QPersistentModelIndex twoIndex;
  qint32 local_3dc;
  qsizetype local_3d8;
  QSignalSpy *local_3d0;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  QModelIndex local_398;
  qint32 local_37c;
  qsizetype local_378;
  QSignalSpy *local_370;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QModelIndex local_338;
  qint32 local_31c;
  qsizetype local_318;
  QSignalSpy *local_310;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  QModelIndex local_2d8;
  qint32 local_2bc;
  qsizetype local_2b8;
  QSignalSpy *local_2b0;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  QModelIndex local_278;
  qint32 local_25c;
  qsizetype local_258;
  QSignalSpy *local_250;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  QModelIndex local_218;
  qint32 local_1fc;
  qsizetype local_1f8;
  QSignalSpy *local_1f0;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QModelIndex local_1b8;
  anon_class_8_1_ce415857 local_1a0;
  anon_class_8_1_ce415857 resetData;
  QSignalSpy *spyArr [2];
  undefined1 local_180 [8];
  QSignalSpy rowsMovedSpy;
  undefined1 local_f8 [8];
  QSignalSpy rowsAboutToBeMovedSpy;
  QModelIndex local_60;
  undefined1 local_38 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_38,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_60);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_f8,(QObject *)&probe.field_0x8,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_f8);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x5e8);
  if ((bVar2 & 1) == 0) {
    rowsMovedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)local_180,(QObject *)&probe.field_0x8,
               "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)local_180);
    bVar2 = QTest::qVerify(bVar1,"rowsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x5ea);
    if ((bVar2 & 1) == 0) {
      rowsMovedSpy._124_4_ = 1;
    }
    else {
      resetData.testModel = (GenericModel *)local_f8;
      spyArr[0] = (QSignalSpy *)local_180;
      local_1a0.testModel = (GenericModel *)&probe.field_0x8;
      moveRowsTable::anon_class_8_1_ce415857::operator()(&local_1a0);
      QModelIndex::QModelIndex(&local_1b8);
      QModelIndex::QModelIndex((QModelIndex *)&__range1);
      bVar2 = GenericModel::moveRows
                        ((QModelIndex *)&probe.field_0x8,(int)&local_1b8,2,(QModelIndex *)0x1,
                         (int)(QModelIndex *)&__range1);
      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                             "!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), -1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x5f3);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        spy = (QSignalSpy *)(spyArr + 1);
        __end1 = (QSignalSpy **)&resetData;
        __begin1 = __end1;
        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
          local_1f0 = *__end1;
          local_1f8 = QList<QList<QVariant>_>::count(&local_1f0->super_QList<QList<QVariant>_>);
          local_1fc = 0;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_1f8,&local_1fc,"spy->count()","0",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x5f5);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            rowsMovedSpy._124_4_ = 1;
            goto LAB_00133608;
          }
        }
        QModelIndex::QModelIndex(&local_218);
        QModelIndex::QModelIndex((QModelIndex *)&__range1_1);
        bVar2 = GenericModel::moveRows
                          ((QModelIndex *)&probe.field_0x8,(int)&local_218,2,(QModelIndex *)0x1,
                           (int)(QModelIndex *)&__range1_1);
        bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                               "!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 7)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x5f6);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          spy_1 = (QSignalSpy *)(spyArr + 1);
          __end1_1 = (QSignalSpy **)&resetData;
          __begin1_1 = __end1_1;
          for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
            local_250 = *__end1_1;
            local_258 = QList<QList<QVariant>_>::count(&local_250->super_QList<QList<QVariant>_>);
            local_25c = 0;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_258,&local_25c,"spy->count()","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x5f8);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              rowsMovedSpy._124_4_ = 1;
              goto LAB_00133608;
            }
          }
          QModelIndex::QModelIndex(&local_278);
          QModelIndex::QModelIndex((QModelIndex *)&__range1_2);
          bVar2 = GenericModel::moveRows
                            ((QModelIndex *)&probe.field_0x8,(int)&local_278,-1,(QModelIndex *)0x1,
                             (int)(QModelIndex *)&__range1_2);
          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                 "!testModel.moveRows(QModelIndex(), -1, 1, QModelIndex(), 3)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x5f9);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            spy_2 = (QSignalSpy *)(spyArr + 1);
            __end1_2 = (QSignalSpy **)&resetData;
            __begin1_2 = __end1_2;
            for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
              local_2b0 = *__end1_2;
              local_2b8 = QList<QList<QVariant>_>::count(&local_2b0->super_QList<QList<QVariant>_>);
              local_2bc = 0;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_2b8,&local_2bc,"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x5fb);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                rowsMovedSpy._124_4_ = 1;
                goto LAB_00133608;
              }
            }
            QModelIndex::QModelIndex(&local_2d8);
            QModelIndex::QModelIndex((QModelIndex *)&__range1_3);
            bVar2 = GenericModel::moveRows
                              ((QModelIndex *)&probe.field_0x8,(int)&local_2d8,6,(QModelIndex *)0x1,
                               (int)(QModelIndex *)&__range1_3);
            bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                   "!testModel.moveRows(QModelIndex(), 6, 1, QModelIndex(), 3)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x5fc);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              spy_3 = (QSignalSpy *)(spyArr + 1);
              __end1_3 = (QSignalSpy **)&resetData;
              __begin1_3 = __end1_3;
              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                local_310 = *__end1_3;
                local_318 = QList<QList<QVariant>_>::count
                                      (&local_310->super_QList<QList<QVariant>_>);
                local_31c = 0;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_318,&local_31c,"spy->count()","0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x5fe);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  rowsMovedSpy._124_4_ = 1;
                  goto LAB_00133608;
                }
              }
              QModelIndex::QModelIndex(&local_338);
              QModelIndex::QModelIndex((QModelIndex *)&__range1_4);
              bVar2 = GenericModel::moveRows
                                ((QModelIndex *)&probe.field_0x8,(int)&local_338,1,
                                 (QModelIndex *)0x2,(int)(QModelIndex *)&__range1_4);
              bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                     "!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 2)",""
                                     ,
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x5ff);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                spy_4 = (QSignalSpy *)(spyArr + 1);
                __end1_4 = (QSignalSpy **)&resetData;
                __begin1_4 = __end1_4;
                for (; (QSignalSpy *)__end1_4 != spy_4; __end1_4 = __end1_4 + 1) {
                  local_370 = *__end1_4;
                  local_378 = QList<QList<QVariant>_>::count
                                        (&local_370->super_QList<QList<QVariant>_>);
                  local_37c = 0;
                  bVar1 = QTest::qCompare<long_long,int>
                                    (&local_378,&local_37c,"spy->count()","0",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x601);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    rowsMovedSpy._124_4_ = 1;
                    goto LAB_00133608;
                  }
                }
                QModelIndex::QModelIndex(&local_398);
                QModelIndex::QModelIndex((QModelIndex *)&__range1_5);
                bVar2 = GenericModel::moveRows
                                  ((QModelIndex *)&probe.field_0x8,(int)&local_398,1,
                                   (QModelIndex *)0x2,(int)(QModelIndex *)&__range1_5);
                bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                       "!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 3)",
                                       "",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x602);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  spy_5 = (QSignalSpy *)(spyArr + 1);
                  __end1_5 = (QSignalSpy **)&resetData;
                  __begin1_5 = __end1_5;
                  for (; (QSignalSpy *)__end1_5 != spy_5; __end1_5 = __end1_5 + 1) {
                    local_3d0 = *__end1_5;
                    local_3d8 = QList<QList<QVariant>_>::count
                                          (&local_3d0->super_QList<QList<QVariant>_>);
                    local_3dc = 0;
                    bVar1 = QTest::qCompare<long_long,int>
                                      (&local_3d8,&local_3dc,"spy->count()","0",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x604);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      rowsMovedSpy._124_4_ = 1;
                      goto LAB_00133608;
                    }
                  }
                  QModelIndex::QModelIndex(&local_418);
                  GenericModel::index((int)local_400,(int)&probe + 8,(QModelIndex *)0x2);
                  QPersistentModelIndex::QPersistentModelIndex(local_3e8,(QModelIndex *)local_400);
                  QModelIndex::QModelIndex(&local_430);
                  QModelIndex::QModelIndex(&local_448);
                  bVar2 = GenericModel::moveRows
                                    ((QModelIndex *)&probe.field_0x8,(int)&local_430,2,
                                     (QModelIndex *)0x1,(int)&local_448);
                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                         "testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 4)"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x607);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_498);
                    GenericModel::index((int)&local_480,(int)&probe + 8,(QModelIndex *)0x0);
                    QModelIndex::data(&local_468,&local_480,0);
                    iVar3 = QVariant::toInt((bool *)&local_468);
                    bVar2 = QTest::qCompare(iVar3,0,"testModel.index(0, 0).data().toInt()","0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x608);
                    QVariant::~QVariant(&local_468);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      QModelIndex::QModelIndex(&local_4e8);
                      GenericModel::index((int)&local_4d0,(int)&probe + 8,(QModelIndex *)0x1);
                      QModelIndex::data(&local_4b8,&local_4d0,0);
                      iVar3 = QVariant::toInt((bool *)&local_4b8);
                      bVar2 = QTest::qCompare(iVar3,1,"testModel.index(1, 0).data().toInt()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x609);
                      QVariant::~QVariant(&local_4b8);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        QModelIndex::QModelIndex(&local_538);
                        GenericModel::index((int)&local_520,(int)&probe + 8,(QModelIndex *)0x2);
                        QModelIndex::data(&local_508,&local_520,0);
                        iVar3 = QVariant::toInt((bool *)&local_508);
                        bVar2 = QTest::qCompare(iVar3,3,"testModel.index(2, 0).data().toInt()","3",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x60a);
                        QVariant::~QVariant(&local_508);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          QModelIndex::QModelIndex(&local_588);
                          GenericModel::index((int)&local_570,(int)&probe + 8,(QModelIndex *)0x3);
                          QModelIndex::data(&local_558,&local_570,0);
                          iVar3 = QVariant::toInt((bool *)&local_558);
                          bVar2 = QTest::qCompare(iVar3,2,"testModel.index(3, 0).data().toInt()","2"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60b);
                          QVariant::~QVariant(&local_558);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            QModelIndex::QModelIndex(&local_5d8);
                            GenericModel::index((int)&local_5c0,(int)&probe + 8,(QModelIndex *)0x4);
                            QModelIndex::data(&local_5a8,&local_5c0,0);
                            iVar3 = QVariant::toInt((bool *)&local_5a8);
                            bVar2 = QTest::qCompare(iVar3,4,"testModel.index(4, 0).data().toInt()",
                                                    "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60c);
                            QVariant::~QVariant(&local_5a8);
                            if (((bVar2 ^ 0xff) & 1) == 0) {
                              QModelIndex::QModelIndex(&local_628);
                              GenericModel::index((int)&local_610,(int)&probe + 8,(QModelIndex *)0x5
                                                 );
                              QModelIndex::data(&local_5f8,&local_610,0);
                              iVar3 = QVariant::toInt((bool *)&local_5f8);
                              bVar2 = QTest::qCompare(iVar3,5,"testModel.index(5, 0).data().toInt()"
                                                      ,"5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60d);
                              QVariant::~QVariant(&local_5f8);
                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                QModelIndex::QModelIndex(&local_680);
                                GenericModel::index((int)&local_668,(int)&probe + 8,
                                                    (QModelIndex *)0x0);
                                QModelIndex::data(&local_650,&local_668,0);
                                local_62a = QVariant::value<QChar>(&local_650);
                                QLatin1Char::QLatin1Char(&local_683,'a');
                                QChar::QChar(&local_682,local_683);
                                bVar1 = QTest::qCompare<QChar,QChar>
                                                  (&local_62a,&local_682,
                                                   "testModel.index(0, 1).data().value<QChar>()",
                                                   "QChar(QLatin1Char(\'a\'))",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60e);
                                QVariant::~QVariant(&local_650);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  QModelIndex::QModelIndex(&local_6d8);
                                  GenericModel::index((int)&local_6c0,(int)&probe + 8,
                                                      (QModelIndex *)0x1);
                                  QModelIndex::data(&local_6a8,&local_6c0,0);
                                  local_686 = QVariant::value<QChar>(&local_6a8);
                                  QLatin1Char::QLatin1Char(&local_6db,'b');
                                  QChar::QChar(&local_6da,local_6db);
                                  bVar1 = QTest::qCompare<QChar,QChar>
                                                    (&local_686,&local_6da,
                                                     "testModel.index(1, 1).data().value<QChar>()",
                                                     "QChar(QLatin1Char(\'b\'))",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60f);
                                  QVariant::~QVariant(&local_6a8);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    QModelIndex::QModelIndex(&local_730);
                                    GenericModel::index((int)&local_718,(int)&probe + 8,
                                                        (QModelIndex *)0x2);
                                    QModelIndex::data(&local_700,&local_718,0);
                                    local_6de = QVariant::value<QChar>(&local_700);
                                    QLatin1Char::QLatin1Char(&local_733,'d');
                                    QChar::QChar(&local_732,local_733);
                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                      (&local_6de,&local_732,
                                                       "testModel.index(2, 1).data().value<QChar>()"
                                                       ,"QChar(QLatin1Char(\'d\'))",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x610);
                                    QVariant::~QVariant(&local_700);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      QModelIndex::QModelIndex(&local_788);
                                      GenericModel::index((int)&local_770,(int)&probe + 8,
                                                          (QModelIndex *)0x3);
                                      QModelIndex::data(&local_758,&local_770,0);
                                      local_736 = QVariant::value<QChar>(&local_758);
                                      QLatin1Char::QLatin1Char(&local_78b,'c');
                                      QChar::QChar(&local_78a,local_78b);
                                      bVar1 = QTest::qCompare<QChar,QChar>
                                                        (&local_736,&local_78a,
                                                                                                                  
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x611);
                                      QVariant::~QVariant(&local_758);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        QModelIndex::QModelIndex(&local_7e0);
                                        GenericModel::index((int)&local_7c8,(int)&probe + 8,
                                                            (QModelIndex *)0x4);
                                        QModelIndex::data(&local_7b0,&local_7c8,0);
                                        local_78e = QVariant::value<QChar>(&local_7b0);
                                        QLatin1Char::QLatin1Char(&local_7e3,'e');
                                        QChar::QChar(&local_7e2,local_7e3);
                                        bVar1 = QTest::qCompare<QChar,QChar>
                                                          (&local_78e,&local_7e2,
                                                                                                                      
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x612);
                                        QVariant::~QVariant(&local_7b0);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          QModelIndex::QModelIndex(&local_838);
                                          GenericModel::index((int)&local_820,(int)&probe + 8,
                                                              (QModelIndex *)0x5);
                                          QModelIndex::data(&local_808,&local_820,0);
                                          local_7e6 = QVariant::value<QChar>(&local_808);
                                          QLatin1Char::QLatin1Char(&local_83b,'f');
                                          QChar::QChar(&local_83a,local_83b);
                                          bVar1 = QTest::qCompare<QChar,QChar>
                                                            (&local_7e6,&local_83a,
                                                                                                                          
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x613);
                                          QVariant::~QVariant(&local_808);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            QPersistentModelIndex::data((int)&local_860);
                                            local_83e = QVariant::value<QChar>(&local_860);
                                            QLatin1Char::QLatin1Char
                                                      ((QLatin1Char *)((long)&__range1_6 + 5),'c');
                                            QChar::QChar((QChar *)((long)&__range1_6 + 6),
                                                         __range1_6._5_1_);
                                            bVar1 = QTest::qCompare<QChar,QChar>
                                                              (&local_83e,
                                                               (QChar *)((long)&__range1_6 + 6),
                                                               "twoIndex.data().value<QChar>()",
                                                               "QChar(QLatin1Char(\'c\'))",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x614);
                                            QVariant::~QVariant(&local_860);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              iVar3 = QPersistentModelIndex::row();
                                              bVar2 = QTest::qCompare(iVar3,3,"twoIndex.row()","3",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x615);
                                              if ((bVar2 & 1) == 0) {
                                                rowsMovedSpy._124_4_ = 1;
                                              }
                                              else {
                                                spy_6 = (QSignalSpy *)(spyArr + 1);
                                                __end1_6 = (QSignalSpy **)&resetData;
                                                __begin1_6 = __end1_6;
                                                for (; (QSignalSpy *)__end1_6 != spy_6;
                                                    __end1_6 = __end1_6 + 1) {
                                                  local_888 = *__end1_6;
                                                  local_890 = QList<QList<QVariant>_>::count
                                                                        (&local_888->
                                                                                                                                                    
                                                  super_QList<QList<QVariant>_>);
                                                  args.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_890,
                                                                     (qint32 *)
                                                                     ((long)&args.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x617);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_001335fc;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_8b0,
                                                             &local_888->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_8b0,0);
                                                  QVariant::value<QModelIndex>(&local_8c8,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_8c8);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x619);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_8b0,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61a);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_8b0,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61b);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_8b0,3);
                                                    QVariant::value<QModelIndex>(&local_8e0,pQVar4);
                                                    bVar1 = QModelIndex::isValid(&local_8e0);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61c);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_8b0,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "args.at(4).toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61d);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_8b0);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_001335fc;
                                                }
                                                moveRowsTable::anon_class_8_1_ce415857::operator()
                                                          (&local_1a0);
                                                QModelIndex::QModelIndex(&local_910);
                                                GenericModel::index((int)local_8f8,(int)&probe + 8,
                                                                    (QModelIndex *)0x2);
                                                QPersistentModelIndex::operator=
                                                          (local_3e8,(QModelIndex *)local_8f8);
                                                QModelIndex::QModelIndex(&local_928);
                                                QModelIndex::QModelIndex(&local_940);
                                                bVar2 = GenericModel::moveRows
                                                                  ((QModelIndex *)&probe.field_0x8,
                                                                   (int)&local_928,2,
                                                                   (QModelIndex *)0x1,
                                                                   (int)&local_940);
                                                bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                              
                                                  "testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x622);
                                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                                  QModelIndex::QModelIndex(&local_990);
                                                  GenericModel::index((int)&local_978,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x0);
                                                  QModelIndex::data(&local_960,&local_978,0);
                                                  iVar3 = QVariant::toInt((bool *)&local_960);
                                                  bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(0, 0).data().toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x623);
                                                  QVariant::~QVariant(&local_960);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_9e0);
                                                    GenericModel::index((int)&local_9c8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_9b0,&local_9c8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_9b0);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.index(1, 0).data().toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x624);
                                                  QVariant::~QVariant(&local_9b0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a30);
                                                    GenericModel::index((int)&local_a18,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_a00,&local_a18,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_a00);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(2, 0).data().toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x625);
                                                  QVariant::~QVariant(&local_a00);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a80);
                                                    GenericModel::index((int)&local_a68,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_a50,&local_a68,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_a50);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(3, 0).data().toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x626);
                                                  QVariant::~QVariant(&local_a50);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_ad0);
                                                    GenericModel::index((int)&local_ab8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_aa0,&local_ab8,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_aa0);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(4, 0).data().toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x627);
                                                  QVariant::~QVariant(&local_aa0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_b20);
                                                    GenericModel::index((int)&local_b08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_af0,&local_b08,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_af0);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(5, 0).data().toInt()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x628);
                                                  QVariant::~QVariant(&local_af0);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_b78);
                                                    GenericModel::index((int)&local_b60,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_b48,&local_b60,0);
                                                    local_b22 = QVariant::value<QChar>(&local_b48);
                                                    QLatin1Char::QLatin1Char(&local_b7b,'c');
                                                    QChar::QChar(&local_b7a,local_b7b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_b22,&local_b7a,
                                                                                                                                              
                                                  "testModel.index(0, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x629);
                                                  QVariant::~QVariant(&local_b48);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_bd0);
                                                    GenericModel::index((int)&local_bb8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_ba0,&local_bb8,0);
                                                    local_b7e = QVariant::value<QChar>(&local_ba0);
                                                    QLatin1Char::QLatin1Char(&local_bd3,'a');
                                                    QChar::QChar(&local_bd2,local_bd3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_b7e,&local_bd2,
                                                                                                                                              
                                                  "testModel.index(1, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62a);
                                                  QVariant::~QVariant(&local_ba0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_c28);
                                                    GenericModel::index((int)&local_c10,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_bf8,&local_c10,0);
                                                    local_bd6 = QVariant::value<QChar>(&local_bf8);
                                                    QLatin1Char::QLatin1Char(&local_c2b,'b');
                                                    QChar::QChar(&local_c2a,local_c2b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_bd6,&local_c2a,
                                                                                                                                              
                                                  "testModel.index(2, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62b);
                                                  QVariant::~QVariant(&local_bf8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_c80);
                                                    GenericModel::index((int)&local_c68,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_c50,&local_c68,0);
                                                    local_c2e = QVariant::value<QChar>(&local_c50);
                                                    QLatin1Char::QLatin1Char(&local_c83,'d');
                                                    QChar::QChar(&local_c82,local_c83);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_c2e,&local_c82,
                                                                                                                                              
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62c);
                                                  QVariant::~QVariant(&local_c50);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_cd8);
                                                    GenericModel::index((int)&local_cc0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_ca8,&local_cc0,0);
                                                    local_c86 = QVariant::value<QChar>(&local_ca8);
                                                    QLatin1Char::QLatin1Char(&local_cdb,'e');
                                                    QChar::QChar(&local_cda,local_cdb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_c86,&local_cda,
                                                                                                                                              
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62d);
                                                  QVariant::~QVariant(&local_ca8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_d30);
                                                    GenericModel::index((int)&local_d18,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_d00,&local_d18,0);
                                                    local_cde = QVariant::value<QChar>(&local_d00);
                                                    QLatin1Char::QLatin1Char(&local_d33,'f');
                                                    QChar::QChar(&local_d32,local_d33);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_cde,&local_d32,
                                                                                                                                              
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62e);
                                                  QVariant::~QVariant(&local_d00);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_d58);
                                                    local_d36 = QVariant::value<QChar>(&local_d58);
                                                    QLatin1Char::QLatin1Char
                                                              ((QLatin1Char *)
                                                               ((long)&__range1_7 + 5),'c');
                                                    QChar::QChar((QChar *)((long)&__range1_7 + 6),
                                                                 __range1_7._5_1_);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_d36,
                                                                       (QChar *)((long)&__range1_7 +
                                                                                6),
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62f);
                                                  QVariant::~QVariant(&local_d58);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,0,"twoIndex.row()"
                                                                            ,"0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x630);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    spy_7 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_7 = (QSignalSpy **)&resetData;
                                                    __begin1_7 = __end1_7;
                                                    for (; (QSignalSpy *)__end1_7 != spy_7;
                                                        __end1_7 = __end1_7 + 1) {
                                                      local_d80 = *__end1_7;
                                                      local_d88 = QList<QList<QVariant>_>::count
                                                                            (&local_d80->
                                                                                                                                                            
                                                  super_QList<QList<QVariant>_>);
                                                  args_1.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_d88,
                                                                     (qint32 *)
                                                                     ((long)&args_1.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x632);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_001335fc;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_da8,
                                                             &local_d80->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_da8,0);
                                                  QVariant::value<QModelIndex>(&local_dc0,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_dc0);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x634);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_da8,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x635);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_da8,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x636);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_da8,3);
                                                    QVariant::value<QModelIndex>(&local_dd8,pQVar4);
                                                    bVar1 = QModelIndex::isValid(&local_dd8);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x637);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_da8,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x638);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_da8);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_001335fc;
                                                  }
                                                  moveRowsTable::anon_class_8_1_ce415857::operator()
                                                            (&local_1a0);
                                                  QModelIndex::QModelIndex(&local_e08);
                                                  GenericModel::index((int)local_df0,(int)&probe + 8
                                                                      ,(QModelIndex *)0x2);
                                                  QPersistentModelIndex::operator=
                                                            (local_3e8,(QModelIndex *)local_df0);
                                                  QModelIndex::QModelIndex(&local_e20);
                                                  QModelIndex::QModelIndex(&local_e38);
                                                  bVar2 = GenericModel::moveRows
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)&local_e20,2,
                                                                     (QModelIndex *)0x1,
                                                                     (int)&local_e38);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 6)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x63d);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_e88);
                                                    GenericModel::index((int)&local_e70,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_e58,&local_e70,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_e58);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.index(0, 0).data().toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x63e);
                                                  QVariant::~QVariant(&local_e58);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_ed8);
                                                    GenericModel::index((int)&local_ec0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_ea8,&local_ec0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_ea8);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(1, 0).data().toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x63f);
                                                  QVariant::~QVariant(&local_ea8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_f28);
                                                    GenericModel::index((int)&local_f10,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_ef8,&local_f10,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_ef8);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(2, 0).data().toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x640);
                                                  QVariant::~QVariant(&local_ef8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_f78);
                                                    GenericModel::index((int)&local_f60,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_f48,&local_f60,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_f48);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(3, 0).data().toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x641);
                                                  QVariant::~QVariant(&local_f48);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_fc8);
                                                    GenericModel::index((int)&local_fb0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_f98,&local_fb0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_f98);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(4, 0).data().toInt()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x642);
                                                  QVariant::~QVariant(&local_f98);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1018);
                                                    GenericModel::index((int)&local_1000,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_fe8,&local_1000,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_fe8);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(5, 0).data().toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x643);
                                                  QVariant::~QVariant(&local_fe8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1070);
                                                    GenericModel::index((int)&local_1058,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1040,&local_1058,0);
                                                    local_101a = QVariant::value<QChar>(&local_1040)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_1073,'a');
                                                    QChar::QChar(&local_1072,local_1073);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_101a,&local_1072,
                                                                                                                                              
                                                  "testModel.index(0, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x644);
                                                  QVariant::~QVariant(&local_1040);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_10c8);
                                                    GenericModel::index((int)&local_10b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1098,&local_10b0,0);
                                                    local_1076 = QVariant::value<QChar>(&local_1098)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_10cb,'b');
                                                    QChar::QChar(&local_10ca,local_10cb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1076,&local_10ca,
                                                                                                                                              
                                                  "testModel.index(1, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x645);
                                                  QVariant::~QVariant(&local_1098);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1120);
                                                    GenericModel::index((int)&local_1108,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_10f0,&local_1108,0);
                                                    local_10ce = QVariant::value<QChar>(&local_10f0)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_1123,'d');
                                                    QChar::QChar(&local_1122,local_1123);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_10ce,&local_1122,
                                                                                                                                              
                                                  "testModel.index(2, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x646);
                                                  QVariant::~QVariant(&local_10f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1178);
                                                    GenericModel::index((int)&local_1160,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_1148,&local_1160,0);
                                                    local_1126 = QVariant::value<QChar>(&local_1148)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_117b,'e');
                                                    QChar::QChar(&local_117a,local_117b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1126,&local_117a,
                                                                                                                                              
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x647);
                                                  QVariant::~QVariant(&local_1148);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_11d0);
                                                    GenericModel::index((int)&local_11b8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_11a0,&local_11b8,0);
                                                    local_117e = QVariant::value<QChar>(&local_11a0)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_11d3,'f');
                                                    QChar::QChar(&local_11d2,local_11d3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_117e,&local_11d2,
                                                                                                                                              
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x648);
                                                  QVariant::~QVariant(&local_11a0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1228);
                                                    GenericModel::index((int)&local_1210,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_11f8,&local_1210,0);
                                                    local_11d6 = QVariant::value<QChar>(&local_11f8)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_122b,'c');
                                                    QChar::QChar(&local_122a,local_122b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_11d6,&local_122a,
                                                                                                                                              
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x649);
                                                  QVariant::~QVariant(&local_11f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_1250);
                                                    local_122e = QVariant::value<QChar>(&local_1250)
                                                    ;
                                                    QLatin1Char::QLatin1Char
                                                              ((QLatin1Char *)
                                                               ((long)&__range1_8 + 5),'c');
                                                    QChar::QChar((QChar *)((long)&__range1_8 + 6),
                                                                 __range1_8._5_1_);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_122e,
                                                                       (QChar *)((long)&__range1_8 +
                                                                                6),
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64a);
                                                  QVariant::~QVariant(&local_1250);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,5,"twoIndex.row()"
                                                                            ,"5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64b);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    spy_8 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_8 = (QSignalSpy **)&resetData;
                                                    __begin1_8 = __end1_8;
                                                    for (; (QSignalSpy *)__end1_8 != spy_8;
                                                        __end1_8 = __end1_8 + 1) {
                                                      local_1278 = *__end1_8;
                                                      local_1280 = QList<QList<QVariant>_>::count
                                                                             (&local_1278->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_2.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1280,
                                                                     (qint32 *)
                                                                     ((long)&args_2.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64d);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_001335fc;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_12a0,
                                                             &local_1278->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_12a0,0);
                                                  QVariant::value<QModelIndex>(&local_12b8,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_12b8);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64f);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_12a0,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x650);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_12a0,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x651);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_12a0,3);
                                                    QVariant::value<QModelIndex>
                                                              ((QModelIndex *)&oneIndex,pQVar4);
                                                    bVar1 = QModelIndex::isValid
                                                                      ((QModelIndex *)&oneIndex);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x652);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_12a0,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x653);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_12a0);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_001335fc;
                                                  }
                                                  moveRowsTable::anon_class_8_1_ce415857::operator()
                                                            (&local_1a0);
                                                  QModelIndex::QModelIndex(&local_1308);
                                                  GenericModel::index((int)local_12f0,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            (local_12d8,(QModelIndex *)local_12f0);
                                                  QModelIndex::QModelIndex(&local_1320);
                                                  QModelIndex::QModelIndex(&local_1338);
                                                  bVar2 = GenericModel::moveRows
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)&local_1320,0,
                                                                     (QModelIndex *)0x2,
                                                                     (int)&local_1338);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveRows(QModelIndex(), 0, 2, QModelIndex(), 3)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x658);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1388);
                                                    GenericModel::index((int)&local_1370,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1358,&local_1370,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_1358);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(0, 0).data().toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x659);
                                                  QVariant::~QVariant(&local_1358);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_13d8);
                                                    GenericModel::index((int)&local_13c0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_13a8,&local_13c0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_13a8);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.index(1, 0).data().toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65a);
                                                  QVariant::~QVariant(&local_13a8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1428);
                                                    GenericModel::index((int)&local_1410,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_13f8,&local_1410,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_13f8);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(2, 0).data().toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65b);
                                                  QVariant::~QVariant(&local_13f8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1478);
                                                    GenericModel::index((int)&local_1460,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_1448,&local_1460,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_1448);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(3, 0).data().toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65c);
                                                  QVariant::~QVariant(&local_1448);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_14c8);
                                                    GenericModel::index((int)&local_14b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_1498,&local_14b0,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_1498);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(4, 0).data().toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65d);
                                                  QVariant::~QVariant(&local_1498);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1518);
                                                    GenericModel::index((int)&local_1500,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_14e8,&local_1500,0);
                                                    iVar3 = QVariant::toInt((bool *)&local_14e8);
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(5, 0).data().toInt()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65e);
                                                  QVariant::~QVariant(&local_14e8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1570);
                                                    GenericModel::index((int)&local_1558,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1540,&local_1558,0);
                                                    local_151a = QVariant::value<QChar>(&local_1540)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_1573,'c');
                                                    QChar::QChar(&local_1572,local_1573);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_151a,&local_1572,
                                                                                                                                              
                                                  "testModel.index(0, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65f);
                                                  QVariant::~QVariant(&local_1540);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_15c8);
                                                    GenericModel::index((int)&local_15b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1598,&local_15b0,0);
                                                    local_1576 = QVariant::value<QChar>(&local_1598)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_15cb,'a');
                                                    QChar::QChar(&local_15ca,local_15cb);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1576,&local_15ca,
                                                                                                                                              
                                                  "testModel.index(1, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x660);
                                                  QVariant::~QVariant(&local_1598);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1620);
                                                    GenericModel::index((int)&local_1608,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_15f0,&local_1608,0);
                                                    local_15ce = QVariant::value<QChar>(&local_15f0)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_1623,'b');
                                                    QChar::QChar(&local_1622,local_1623);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_15ce,&local_1622,
                                                                                                                                              
                                                  "testModel.index(2, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x661);
                                                  QVariant::~QVariant(&local_15f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1678);
                                                    GenericModel::index((int)&local_1660,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_1648,&local_1660,0);
                                                    local_1626 = QVariant::value<QChar>(&local_1648)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_167b,'d');
                                                    QChar::QChar(&local_167a,local_167b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1626,&local_167a,
                                                                                                                                              
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x662);
                                                  QVariant::~QVariant(&local_1648);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_16d0);
                                                    GenericModel::index((int)&local_16b8,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_16a0,&local_16b8,0);
                                                    local_167e = QVariant::value<QChar>(&local_16a0)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_16d3,'e');
                                                    QChar::QChar(&local_16d2,local_16d3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_167e,&local_16d2,
                                                                                                                                              
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x663);
                                                  QVariant::~QVariant(&local_16a0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_1728);
                                                    GenericModel::index((int)&local_1710,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_16f8,&local_1710,0);
                                                    local_16d6 = QVariant::value<QChar>(&local_16f8)
                                                    ;
                                                    QLatin1Char::QLatin1Char(&local_172b,'f');
                                                    QChar::QChar(&local_172a,local_172b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_16d6,&local_172a,
                                                                                                                                              
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x664);
                                                  QVariant::~QVariant(&local_16f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_1750);
                                                    local_172e = QVariant::value<QChar>(&local_1750)
                                                    ;
                                                    QLatin1Char::QLatin1Char
                                                              ((QLatin1Char *)
                                                               ((long)&__range1_9 + 5),'b');
                                                    QChar::QChar((QChar *)((long)&__range1_9 + 6),
                                                                 __range1_9._5_1_);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_172e,
                                                                       (QChar *)((long)&__range1_9 +
                                                                                6),
                                                                                                                                              
                                                  "oneIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x665);
                                                  QVariant::~QVariant(&local_1750);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,2,"oneIndex.row()"
                                                                            ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x666);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    spy_9 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_9 = (QSignalSpy **)&resetData;
                                                    __begin1_9 = __end1_9;
                                                    for (; (QSignalSpy *)__end1_9 != spy_9;
                                                        __end1_9 = __end1_9 + 1) {
                                                      local_1778 = *__end1_9;
                                                      local_1780 = QList<QList<QVariant>_>::count
                                                                             (&local_1778->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_3.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1780,
                                                                     (qint32 *)
                                                                     ((long)&args_3.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x668);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_001335f0;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_17a0,
                                                             &local_1778->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_17a0,0);
                                                  QVariant::value<QModelIndex>(&local_17b8,pQVar4);
                                                  bVar1 = QModelIndex::isValid(&local_17b8);
                                                  bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66a);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_17a0,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66b);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_17a0,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66c);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_17a0,3);
                                                    QVariant::value<QModelIndex>(&local_17d0,pQVar4)
                                                    ;
                                                    bVar1 = QModelIndex::isValid(&local_17d0);
                                                    bVar2 = QTest::qVerify(!bVar1,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66d);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_17a0,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66e);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_17a0);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_001335f0;
                                                  }
                                                  rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
LAB_001335f0:
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            (local_12d8);
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                }
                                                else {
                                                  rowsMovedSpy._124_4_ = 1;
                                                }
                                              }
                                            }
                                            else {
                                              rowsMovedSpy._124_4_ = 1;
                                            }
                                          }
                                          else {
                                            rowsMovedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          rowsMovedSpy._124_4_ = 1;
                                        }
                                      }
                                      else {
                                        rowsMovedSpy._124_4_ = 1;
                                      }
                                    }
                                    else {
                                      rowsMovedSpy._124_4_ = 1;
                                    }
                                  }
                                  else {
                                    rowsMovedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  rowsMovedSpy._124_4_ = 1;
                                }
                              }
                              else {
                                rowsMovedSpy._124_4_ = 1;
                              }
                            }
                            else {
                              rowsMovedSpy._124_4_ = 1;
                            }
                          }
                          else {
                            rowsMovedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          rowsMovedSpy._124_4_ = 1;
                        }
                      }
                      else {
                        rowsMovedSpy._124_4_ = 1;
                      }
                    }
                    else {
                      rowsMovedSpy._124_4_ = 1;
                    }
                  }
                  else {
                    rowsMovedSpy._124_4_ = 1;
                  }
LAB_001335fc:
                  QPersistentModelIndex::~QPersistentModelIndex(local_3e8);
                }
                else {
                  rowsMovedSpy._124_4_ = 1;
                }
              }
              else {
                rowsMovedSpy._124_4_ = 1;
              }
            }
            else {
              rowsMovedSpy._124_4_ = 1;
            }
          }
          else {
            rowsMovedSpy._124_4_ = 1;
          }
        }
        else {
          rowsMovedSpy._124_4_ = 1;
        }
      }
      else {
        rowsMovedSpy._124_4_ = 1;
      }
    }
LAB_00133608:
    QSignalSpy::~QSignalSpy((QSignalSpy *)local_180);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_f8);
  ModelTest::~ModelTest((ModelTest *)local_38);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsTable()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 6);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    const auto resetData = [&testModel]() {
        for (int i = 0; i < 6; ++i) {
            testModel.setData(testModel.index(i, 0), i);
            testModel.setData(testModel.index(i, 1), QChar('a' + i));
        }
    };
    resetData();
    QVERIFY(!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), -1, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 6, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 4));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 4);
    }

    resetData();
    twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 0));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 0);
    }

    resetData();
    twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 6));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 6);
    }

    resetData();
    QPersistentModelIndex oneIndex = testModel.index(1, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 0, 2, QModelIndex(), 3));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(oneIndex.data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(oneIndex.row(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 3);
    }
}